

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O2

bool __thiscall PDA::Transducer::StoreFst::step(StoreFst *this)

{
  pointer pwVar1;
  pointer pRVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  Settings *pSVar6;
  wostream *pwVar7;
  long lVar8;
  allocator<wchar_t> local_41;
  wstring local_40 [32];
  
  if ((this->m_currentState).m_sourcePosition <
      (int)(((long)(this->m_tokens).
                   super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_tokens).
                  super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x14)) {
    if ((this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      bVar4 = isTerminalOnTop(this);
      if (!bVar4) {
        if ((this->m_currentState).m_ruleIndex == -1) {
          iVar5 = findRule(this,(this->m_currentState).m_stack.
                                super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl.
                                super__Vector_impl_data._M_finish[-1]);
          (this->m_currentState).m_ruleIndex = iVar5;
          (this->m_currentState).m_chainIndex = -1;
          if (iVar5 == -1) {
            pSVar6 = Utils::Settings::Instance();
            bVar4 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
            if (bVar4) {
              *(undefined8 *)(wmemcmp + *(long *)(std::wcerr + -0x18)) = 10;
              pwVar7 = std::operator<<((wostream *)&std::wcerr,L"Error: no rule found(");
              pwVar7 = std::operator<<(pwVar7,(this->m_currentState).m_stack.
                                              super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                                              _M_impl.super__Vector_impl_data._M_finish[-1]);
              pwVar7 = std::operator<<(pwVar7,L')');
              std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar7);
            }
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      (local_40,L"Grammar error, no rule",&local_41);
            raise(this,(int)local_40);
          }
        }
        pSVar6 = Utils::Settings::Instance();
        bVar4 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
        if (bVar4) {
          *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
          pwVar7 = std::operator<<((wostream *)&std::wcout,L"NT ");
          pwVar7 = std::operator<<(pwVar7,(this->m_currentState).m_stack.
                                          super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
                                          _M_impl.super__Vector_impl_data._M_finish[-1]);
          pwVar7 = std::operator<<(pwVar7,L"[");
          pwVar7 = (wostream *)
                   std::wostream::operator<<
                             ((wostream *)pwVar7,(this->m_currentState).m_chainIndex + 1);
          pwVar7 = std::operator<<(pwVar7,L"]-> ");
          lVar8 = (long)(this->m_currentState).m_chainIndex + 1;
          iVar5 = (this->m_currentState).m_ruleIndex;
          pRVar2 = (this->m_grammar).m_rules.
                   super__Vector_base<PDA::Transducer::Grammar::Rule,_std::allocator<PDA::Transducer::Grammar::Rule>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar3 = *(long *)&pRVar2[iVar5].m_chains.
                            super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
          ;
          if ((int)lVar8 <
              (int)((ulong)((long)*(pointer *)
                                   ((long)&pRVar2[iVar5].m_chains.
                                           super__Vector_base<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>
                                   + 8) - lVar3) >> 5)) {
            std::__cxx11::wstring::wstring(local_40,(wstring *)(lVar3 + lVar8 * 0x20));
          }
          else {
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_40,L"<EMPTY>",&local_41);
          }
          pwVar7 = std::operator<<(pwVar7,local_40);
          std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar7);
          std::__cxx11::wstring::~wstring(local_40);
        }
        std::
        deque<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>::
        push_back(&(this->m_states).c,&this->m_currentState);
        expandCurrentNTerminal(this);
        goto LAB_00125162;
      }
      pwVar1 = (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar5 = (this->m_currentState).m_sourcePosition;
      if (pwVar1[-1] ==
          (this->m_tokens).
          super__Vector_base<PDA::Transducer::Token,_std::allocator<PDA::Transducer::Token>_>.
          _M_impl.super__Vector_impl_data._M_start[iVar5].token) {
        (this->m_currentState).m_sourcePosition = iVar5 + 1;
        (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_finish = pwVar1 + -1;
        goto LAB_00125162;
      }
    }
  }
  else {
    pSVar6 = Utils::Settings::Instance();
    bVar4 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
    if (bVar4) {
      *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
      pwVar7 = std::operator<<((wostream *)&std::wcout,L"Source empty");
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar7);
    }
    if ((this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (this->m_currentState).m_stack.super__Vector_base<wchar_t,_std::allocator<wchar_t>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pSVar6 = Utils::Settings::Instance();
      bVar4 = Utils::Settings::isSyntaxTraceEnabled(pSVar6);
      if (bVar4) {
        *(undefined8 *)(std::locale::global + *(long *)(std::wcout + -0x18)) = 10;
        pwVar7 = std::operator<<((wostream *)&std::wcout,L"Parsing complete");
        std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar7);
      }
      return false;
    }
    if ((this->m_states).c.
        super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->m_states).c.
        super__Deque_base<PDA::Transducer::StoreFst::State,_std::allocator<PDA::Transducer::StoreFst::State>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_40,L"mismatch",&local_41);
      raise(this,(int)local_40);
    }
  }
  rollback(this);
LAB_00125162:
  debugLine(this);
  return true;
}

Assistant:

bool step()
    {
        if (m_currentState.m_sourcePosition < static_cast<int>(m_tokens.size()))
        {
            if (!m_currentState.m_stack.empty())
            {
                if (!isTerminalOnTop())
                {
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        m_currentState.m_ruleIndex = findRule(m_currentState.m_stack.back());
                        m_currentState.m_chainIndex = -1;
                    }
                    if (m_currentState.m_ruleIndex == -1)
                    {
                        if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                            std::wcerr << std::setw(10) << L"Error: no rule found(" << m_currentState.m_stack.back() << L')' << std::endl;
                        raise(L"Grammar error, no rule");
                    }
                    if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                        std::wcout << std::setw(10) << L"NT " << m_currentState.m_stack.back() << L"[" << m_currentState.m_chainIndex + 1 << L"]-> "
                                   << ((m_currentState.m_chainIndex + 1 < static_cast<int>(m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains.size())) ?
                                    m_grammar.rules()[static_cast<size_t>(m_currentState.m_ruleIndex)].m_chains[static_cast<size_t>(m_currentState.m_chainIndex + 1)].m_chain : L"<EMPTY>") << std::endl;

                    m_states.push(m_currentState);
                    expandCurrentNTerminal();
                }
                else
                {
                    if (m_currentState.m_stack.back() == m_tokens[static_cast<size_t>(m_currentState.m_sourcePosition)].token)
                    {
                        ++m_currentState.m_sourcePosition;
                        m_currentState.m_stack.pop_back();
                    }
                    else
                    {
                        rollback();
                    }
                }
            }
            else // Store empty
            {

                rollback();
            }
        }
        else // End of source
        {
            if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                std::wcout << std::setw(10) << L"Source empty" << std::endl;
            if (m_currentState.m_stack.empty())
            {
                if (Utils::Settings::Instance().isSyntaxTraceEnabled())
                    std::wcout << std::setw(10) << L"Parsing complete" << std::endl;
                return false;
            }
            else
            {
                if (m_states.empty())
                    raise(L"mismatch");
                else
                    rollback();
            }
        }
        debugLine();
        return true;
    }